

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<768,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined4 in_stack_ffffffffffffff68;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  pfHash in_stack_ffffffffffffff80;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x300,pcVar5,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x172f0f);
  Blob<768>::Blob((Blob<768> *)&stack0xffffffffffffff78);
  memset(&stack0xffffffffffffff78,0,0x60);
  if ((local_d & 1) != 0) {
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffff78,0x60,0,pvVar3);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<768>,Blob<160>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             (bool)in_stack_ffffffffffffff77,
             (Blob<768> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(in_ESI,in_EDX));
  sVar4 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<160>>
                    ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)k.bytes._16_8_,
                     (bool)k.bytes[0xf],(bool)k.bytes[0xe],(bool)k.bytes[0xd],(bool)k.bytes[0xc],
                     (bool)k.bytes[0xb]);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}